

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::GeneratorStmtCacheVisitor::visit(GeneratorStmtCacheVisitor *this,Generator *generator)

{
  Generator *generator_local;
  GeneratorStmtCacheVisitor *this_local;
  
  if ((this->value_ & 1U) == 0) {
    Generator::set_use_stmt_remove_cache(generator,false);
    Generator::clear_remove_stmt_cache(generator);
  }
  else {
    Generator::set_use_stmt_remove_cache(generator,true);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (value_) {
            // set to use cache
            generator->set_use_stmt_remove_cache(true);
        } else {
            // disable cache
            generator->set_use_stmt_remove_cache(false);
            // remove the stmts in batch
            generator->clear_remove_stmt_cache();
        }
    }